

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDepthStencilTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::gles3::Functional::DepthStencilCase::iterate(DepthStencilCase *this)

{
  IVec2 *pIVar1;
  ReferenceQuadRenderer *pRVar2;
  RenderContext *context;
  IVec2 IVar3;
  bool bVar4;
  deUint32 dVar5;
  deUint32 dVar6;
  int viewportX;
  int viewportY;
  RenderTarget *pRVar7;
  MessageBuilder *this_00;
  long lVar8;
  pointer pDVar9;
  char *pcVar10;
  RenderCommand *pRVar11;
  pointer pDVar12;
  int iVar13;
  IterateResult IVar14;
  pointer pRVar15;
  pointer pRVar16;
  byte bVar17;
  RGBA threshold;
  Surface renderedImg;
  PixelBufferAccess local_328;
  PixelBufferAccess local_300;
  PixelBufferAccess local_2d8;
  PixelBufferAccess local_2b0;
  PixelBufferAccess local_288;
  PixelBufferAccess local_260;
  Random rnd;
  RenderCommand local_224;
  RefRenderCommand refTestCmd;
  
  bVar17 = 0;
  dVar5 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  dVar6 = ::deInt32Hash(this->m_iterNdx);
  deRandom_init(&rnd.m_rnd,dVar5 ^ dVar6);
  pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
  viewportX = de::Random::getInt((Random *)&rnd.m_rnd,0,
                                 pRVar7->m_width - (this->m_renderTarget).width);
  pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
  viewportY = de::Random::getInt((Random *)&rnd.m_rnd,0,
                                 pRVar7->m_height - (this->m_renderTarget).height);
  DepthStencilCaseUtil::RenderCommand::RenderCommand(&local_224);
  tcu::Surface::Surface(&renderedImg,(this->m_renderTarget).width,(this->m_renderTarget).height);
  pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
  threshold = tcu::PixelFormat::getColorThreshold(&pRVar7->m_pixelFormat);
  local_224.color.m_data[0] = 1.0;
  local_224.color.m_data[1] = 0.0;
  local_224.color.m_data[2] = 0.0;
  local_224.color.m_data[3] = 1.0;
  tcu::Vector<bool,_4>::Vector((Vector<bool,_4> *)&refTestCmd,true);
  IVar3 = refTestCmd.quad.posA;
  local_224.colorMask.m_data[0] = (bool)(undefined1)refTestCmd.quad.posA.m_data[0];
  local_224.colorMask.m_data[1] = (bool)refTestCmd.quad.posA.m_data[0]._1_1_;
  local_224.colorMask.m_data[2] = (bool)refTestCmd.quad.posA.m_data[0]._2_1_;
  local_224.colorMask.m_data[3] = (bool)refTestCmd.quad.posA.m_data[0]._3_1_;
  local_224.rect.left = 0;
  local_224.rect.bottom = 0;
  local_224.rect.width = (this->m_renderTarget).width;
  local_224.rect.height = (this->m_renderTarget).height;
  iVar13 = this->m_iterNdx;
  pDVar12 = (this->m_cases).
            super__Vector_base<deqp::gles3::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pDVar9 = pDVar12 + iVar13;
  pRVar11 = &local_224;
  refTestCmd.quad.posA = IVar3;
  for (lVar8 = 0x4d; lVar8 != 0; lVar8 = lVar8 + -1) {
    *(char *)&(pRVar11->params).visibleFace = (char)pDVar9->visibleFace;
    pDVar9 = (pointer)((long)pDVar9 + (ulong)bVar17 * -2 + 1);
    pRVar11 = (RenderCommand *)((long)pRVar11 + (ulong)bVar17 * -2 + 1);
  }
  if ((long)iVar13 == 0) {
    refTestCmd.quad.posA.m_data =
         (int  [2])((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    pIVar1 = &refTestCmd.quad.posB;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pIVar1);
    std::operator<<((ostream *)pIVar1,
                    "Channels:\n  RED: passing pixels\n  GREEN: stencil values\n  BLUE: depth values"
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&refTestCmd,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pIVar1);
    pDVar12 = (this->m_cases).
              super__Vector_base<deqp::gles3::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  if (1 < (ulong)(((long)(this->m_cases).
                         super__Vector_base<deqp::gles3::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar12) / 0x50)) {
    refTestCmd.quad.posA.m_data =
         (int  [2])((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    pIVar1 = &refTestCmd.quad.posB;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pIVar1);
    std::operator<<((ostream *)pIVar1,"Iteration ");
    this_00 = tcu::MessageBuilder::operator<<((MessageBuilder *)&refTestCmd,&this->m_iterNdx);
    std::operator<<(&(this_00->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"...");
    tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pIVar1);
    pDVar12 = (this->m_cases).
              super__Vector_base<deqp::gles3::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  DepthStencilCaseUtil::operator<<
            (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
             pDVar12 + this->m_iterNdx);
  DepthStencilCaseUtil::render(&this->m_baseClears,viewportX,viewportY);
  for (pRVar16 = (this->m_baseDepthRenders).
                 super__Vector_base<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pRVar16 !=
      (this->m_baseDepthRenders).
      super__Vector_base<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand>_>
      ._M_impl.super__Vector_impl_data._M_finish; pRVar16 = pRVar16 + 1) {
    DepthStencilCaseUtil::render(this->m_renderer,pRVar16,viewportX,viewportY);
  }
  DepthStencilCaseUtil::render(this->m_renderer,&local_224,viewportX,viewportY);
  for (pRVar16 = (this->m_visualizeCommands).
                 super__Vector_base<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pRVar16 !=
      (this->m_visualizeCommands).
      super__Vector_base<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RenderCommand>_>
      ._M_impl.super__Vector_impl_data._M_finish; pRVar16 = pRVar16 + 1) {
    DepthStencilCaseUtil::render(this->m_renderer,pRVar16,viewportX,viewportY);
  }
  glwColorMask('\x01','\x01','\x01','\x01');
  glwDepthMask('\x01');
  glwStencilMask(0xffffffff);
  glwFlush();
  DepthStencilCaseUtil::RefRenderCommand::RefRenderCommand(&refTestCmd);
  DepthStencilCaseUtil::translateCommand(&local_224,&refTestCmd,&this->m_renderTarget);
  tcu::Surface::getAccess(&local_328,this->m_refColorBuffer);
  tcu::TextureLevel::getAccess(&local_2b0,this->m_refStencilBuffer);
  DepthStencilCaseUtil::renderReference
            (&this->m_baseClears,&local_328,&local_2b0,(this->m_renderTarget).stencilBits);
  for (pRVar15 = (this->m_refBaseDepthRenders).
                 super__Vector_base<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand>_>
                 ._M_impl.super__Vector_impl_data._M_start; pRVar2 = this->m_refRenderer,
      pRVar15 !=
      (this->m_refBaseDepthRenders).
      super__Vector_base<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand>_>
      ._M_impl.super__Vector_impl_data._M_finish; pRVar15 = pRVar15 + 1) {
    tcu::Surface::getAccess(&local_2b0,this->m_refColorBuffer);
    deqp::gls::FragmentOpUtil::getMultisampleAccess(&local_328,&local_2b0);
    tcu::TextureLevel::getAccess(&local_260,this->m_refDepthBuffer);
    deqp::gls::FragmentOpUtil::getMultisampleAccess(&local_2d8,&local_260);
    tcu::TextureLevel::getAccess(&local_300,this->m_refStencilBuffer);
    deqp::gls::FragmentOpUtil::getMultisampleAccess(&local_288,&local_300);
    deqp::gls::FragmentOpUtil::ReferenceQuadRenderer::render
              (pRVar2,&local_328,&local_2d8,&local_288,&pRVar15->quad,&pRVar15->state);
  }
  tcu::Surface::getAccess(&local_2b0,this->m_refColorBuffer);
  deqp::gls::FragmentOpUtil::getMultisampleAccess(&local_328,&local_2b0);
  tcu::TextureLevel::getAccess(&local_260,this->m_refDepthBuffer);
  deqp::gls::FragmentOpUtil::getMultisampleAccess(&local_2d8,&local_260);
  tcu::TextureLevel::getAccess(&local_300,this->m_refStencilBuffer);
  deqp::gls::FragmentOpUtil::getMultisampleAccess(&local_288,&local_300);
  deqp::gls::FragmentOpUtil::ReferenceQuadRenderer::render
            (pRVar2,&local_328,&local_2d8,&local_288,&refTestCmd.quad,&refTestCmd.state);
  for (pRVar15 = (this->m_refVisualizeCommands).
                 super__Vector_base<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pRVar15 !=
      (this->m_refVisualizeCommands).
      super__Vector_base<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::RefRenderCommand>_>
      ._M_impl.super__Vector_impl_data._M_finish; pRVar15 = pRVar15 + 1) {
    pRVar2 = this->m_refRenderer;
    tcu::Surface::getAccess(&local_2b0,this->m_refColorBuffer);
    deqp::gls::FragmentOpUtil::getMultisampleAccess(&local_328,&local_2b0);
    tcu::TextureLevel::getAccess(&local_260,this->m_refDepthBuffer);
    deqp::gls::FragmentOpUtil::getMultisampleAccess(&local_2d8,&local_260);
    tcu::TextureLevel::getAccess(&local_300,this->m_refStencilBuffer);
    deqp::gls::FragmentOpUtil::getMultisampleAccess(&local_288,&local_300);
    deqp::gls::FragmentOpUtil::ReferenceQuadRenderer::render
              (pRVar2,&local_328,&local_2d8,&local_288,&pRVar15->quad,&pRVar15->state);
  }
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)&refTestCmd,&renderedImg);
  glu::readPixels(context,viewportX,viewportY,(PixelBufferAccess *)&refTestCmd);
  iVar13 = this->m_iterNdx + 1;
  this->m_iterNdx = iVar13;
  pDVar12 = (this->m_cases).
            super__Vector_base<deqp::gles3::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pDVar9 = (this->m_cases).
           super__Vector_base<deqp::gles3::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar4 = tcu::pixelThresholdCompare
                    (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                     "CompareResult","Image Comparison Result",this->m_refColorBuffer,&renderedImg,
                     &threshold,COMPARE_LOG_RESULT);
  IVar14 = CONTINUE;
  refTestCmd.quad.posA.m_data =
       (int  [2])((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pIVar1 = &refTestCmd.quad.posB;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pIVar1);
  pcVar10 = "  FAILED!";
  if (bVar4) {
    pcVar10 = "  Passed.";
  }
  std::operator<<((ostream *)pIVar1,pcVar10);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&refTestCmd,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pIVar1);
  if (bVar4) {
    if (iVar13 < (int)(((long)pDVar12 - (long)pDVar9) / 0x50)) goto LAB_01114246;
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Image comparison failed");
  }
  IVar14 = STOP;
LAB_01114246:
  tcu::Surface::~Surface(&renderedImg);
  return IVar14;
}

Assistant:

DepthStencilCase::IterateResult DepthStencilCase::iterate (void)
{
	de::Random				rnd				(deStringHash(getName()) ^ deInt32Hash(m_iterNdx));
	int						viewportX		= rnd.getInt(0, m_context.getRenderTarget().getWidth()-m_renderTarget.width);
	int						viewportY		= rnd.getInt(0, m_context.getRenderTarget().getHeight()-m_renderTarget.height);
	RenderCommand			testCmd;

	tcu::Surface			renderedImg		(m_renderTarget.width, m_renderTarget.height);
	tcu::RGBA				threshold		= m_context.getRenderTarget().getPixelFormat().getColorThreshold();

	// Fill in test command for this iteration.
	testCmd.color		= Vec4(1.0f, 0.0f, 0.0f, 1.0f);
	testCmd.colorMask	= tcu::BVec4(true);
	testCmd.rect		= rr::WindowRectangle(0, 0, m_renderTarget.width, m_renderTarget.height);
	testCmd.params		= m_cases[m_iterNdx];

	if (m_iterNdx == 0)
	{
		m_testCtx.getLog() << TestLog::Message << "Channels:\n"
													"  RED: passing pixels\n"
													"  GREEN: stencil values\n"
													"  BLUE: depth values"
							<< TestLog::EndMessage;
	}

	if (m_cases.size() > 1)
		m_testCtx.getLog() << TestLog::Message << "Iteration " << m_iterNdx << "..." << TestLog::EndMessage;

	m_testCtx.getLog() << m_cases[m_iterNdx];

	// Submit render commands to gl GL.

	// Base clears.
	render(m_baseClears, viewportX, viewportY);

	// Base depths.
	for (vector<RenderCommand>::const_iterator cmd = m_baseDepthRenders.begin(); cmd != m_baseDepthRenders.end(); ++cmd)
		render(*m_renderer, *cmd, viewportX, viewportY);

	// Test command.
	render(*m_renderer, testCmd, viewportX, viewportY);

	// Visualization commands.
	for (vector<RenderCommand>::const_iterator cmd = m_visualizeCommands.begin(); cmd != m_visualizeCommands.end(); ++cmd)
		render(*m_renderer, *cmd, viewportX, viewportY);

	// Re-enable all write masks.
	glColorMask(GL_TRUE, GL_TRUE, GL_TRUE, GL_TRUE);
	glDepthMask(GL_TRUE);
	glStencilMask(~0u);

	// Ask GPU to start rendering.
	glFlush();

	// Render reference while GPU is doing work.
	{
		RefRenderCommand refTestCmd;
		translateCommand(testCmd, refTestCmd, m_renderTarget);

		// Base clears.
		renderReference(m_baseClears, m_refColorBuffer->getAccess(), m_refStencilBuffer->getAccess(), m_renderTarget.stencilBits);

		// Base depths.
		for (vector<RefRenderCommand>::const_iterator cmd = m_refBaseDepthRenders.begin(); cmd != m_refBaseDepthRenders.end(); ++cmd)
			m_refRenderer->render(gls::FragmentOpUtil::getMultisampleAccess(m_refColorBuffer->getAccess()),
								  gls::FragmentOpUtil::getMultisampleAccess(m_refDepthBuffer->getAccess()),
								  gls::FragmentOpUtil::getMultisampleAccess(m_refStencilBuffer->getAccess()),
								  cmd->quad, cmd->state);

		// Test command.
		m_refRenderer->render(gls::FragmentOpUtil::getMultisampleAccess(m_refColorBuffer->getAccess()),
							  gls::FragmentOpUtil::getMultisampleAccess(m_refDepthBuffer->getAccess()),
							  gls::FragmentOpUtil::getMultisampleAccess(m_refStencilBuffer->getAccess()),
							  refTestCmd.quad, refTestCmd.state);

		// Visualization commands.
		for (vector<RefRenderCommand>::const_iterator cmd = m_refVisualizeCommands.begin(); cmd != m_refVisualizeCommands.end(); ++cmd)
			m_refRenderer->render(gls::FragmentOpUtil::getMultisampleAccess(m_refColorBuffer->getAccess()),
								  gls::FragmentOpUtil::getMultisampleAccess(m_refDepthBuffer->getAccess()),
								  gls::FragmentOpUtil::getMultisampleAccess(m_refStencilBuffer->getAccess()),
								  cmd->quad, cmd->state);
	}

	// Read rendered image.
	glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, renderedImg.getAccess());

	m_iterNdx += 1;

	// Compare to reference.
	bool	isLastIter	= m_iterNdx >= (int)m_cases.size();
	bool	compareOk	= tcu::pixelThresholdCompare(m_testCtx.getLog(), "CompareResult", "Image Comparison Result", *m_refColorBuffer, renderedImg, threshold,
													 tcu::COMPARE_LOG_RESULT);

	m_testCtx.getLog() << TestLog::Message << (compareOk ? "  Passed." : "  FAILED!") << TestLog::EndMessage;
	if (!compareOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");

	if (compareOk && !isLastIter)
		return CONTINUE;
	else
		return STOP;
}